

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<(anonymous_namespace)::BuildSystemFrontendTest_singleNodeBuildLogsMissingInputs_Test>
::CreateTest(TestFactoryImpl<(anonymous_namespace)::BuildSystemFrontendTest_singleNodeBuildLogsMissingInputs_Test>
             *this)

{
  BuildSystemFrontendTest *this_00;
  
  this_00 = (BuildSystemFrontendTest *)operator_new(0x228);
  anon_unknown.dwarf_103e4::BuildSystemFrontendTest::BuildSystemFrontendTest(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__BuildSystemFrontendTest_0023ae48;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }